

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcg64.hpp
# Opt level: O1

basic_ostream<char,_std::char_traits<char>_> *
trng::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,lcg64 *R)

{
  undefined4 uVar1;
  ostream *poVar2;
  char *__s;
  size_t sVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  char local_2c [4];
  
  uVar1 = *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18);
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = 0x26;
  local_2c[0] = '[';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(out,local_2c,1);
  __s = lcg64::name();
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar3);
  }
  local_2c[1] = 0x20;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_2c + 1,1);
  pbVar4 = operator<<(poVar2,&R->P);
  local_2c[2] = 0x20;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(pbVar4,local_2c + 2,1);
  pbVar4 = operator<<(poVar2,&R->S);
  local_2c[3] = 0x5d;
  std::__ostream_insert<char,std::char_traits<char>>(pbVar4,local_2c + 3,1);
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = uVar1;
  return out;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
        std::basic_ostream<char_t, traits_t> &out, const lcg64 &R) {
      std::ios_base::fmtflags flags(out.flags());
      out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      out << '[' << lcg64::name() << ' ' << R.P << ' ' << R.S << ']';
      out.flags(flags);
      return out;
    }